

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendCompileOptions
          (cmLocalGenerator *this,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *options,vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *options_vec,char *regex)

{
  pointer pBVar1;
  bool bVar2;
  pointer pBVar3;
  string flag;
  RegularExpression r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  undefined1 local_260 [560];
  
  if (regex == (char *)0x0) {
    pBVar1 = (options_vec->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar3 = (options_vec->
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pBVar3 != pBVar1; pBVar3 = pBVar3 + 1)
    {
      local_260._8_8_ = (char *)0x0;
      local_260[0x10] = '\0';
      local_260._0_8_ = local_260 + 0x10;
      (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260
                 ,pBVar3);
      std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
      emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                 options,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_260,&pBVar3->Backtrace);
      std::__cxx11::string::~string((string *)local_260);
    }
  }
  else {
    cmsys::RegularExpression::RegularExpression((RegularExpression *)local_260,regex);
    pBVar1 = (options_vec->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pBVar3 = (options_vec->
                  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pBVar3 != pBVar1; pBVar3 = pBVar3 + 1)
    {
      bVar2 = cmsys::RegularExpression::find((RegularExpression *)local_260,&pBVar3->Value);
      if (bVar2) {
        local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
        local_280._M_string_length = 0;
        local_280.field_2._M_local_buf[0] = '\0';
        (*(this->super_cmOutputConverter)._vptr_cmOutputConverter[9])(this,&local_280,pBVar3);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string,cmListFileBacktrace_const&>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   options,&local_280,&pBVar3->Backtrace);
        std::__cxx11::string::~string((string *)&local_280);
      }
    }
    cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_260);
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendCompileOptions(
  std::vector<BT<std::string>>& options,
  const std::vector<BT<std::string>>& options_vec, const char* regex) const
{
  if (regex != nullptr) {
    // Filter flags upon specified regular expressions.
    cmsys::RegularExpression r(regex);

    for (BT<std::string> const& opt : options_vec) {
      if (r.find(opt.Value)) {
        std::string flag;
        this->AppendFlagEscape(flag, opt.Value);
        options.emplace_back(std::move(flag), opt.Backtrace);
      }
    }
  } else {
    for (BT<std::string> const& opt : options_vec) {
      std::string flag;
      this->AppendFlagEscape(flag, opt.Value);
      options.emplace_back(std::move(flag), opt.Backtrace);
    }
  }
}